

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::CallExpression::~CallExpression(CallExpression *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  
  (this->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR__CallExpression_00169810;
  if (this->function != (Expr *)0x0) {
    (*(this->function->super_Node)._vptr_Node[1])();
  }
  this->function = (Expr *)0x0;
  ppEVar1 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar2 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1; ppEVar2 = ppEVar2 + 1
      ) {
    if (*ppEVar2 != (Expr *)0x0) {
      (*((*ppEVar2)->super_Node)._vptr_Node[1])();
    }
  }
  ppEVar2 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar2) {
    (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar2;
  }
  std::_Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>::~_Vector_base
            (&(this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>);
  token::Token::~Token(&this->tok);
  return;
}

Assistant:

~CallExpression(){
        delete function;
        function = nullptr;
        for(auto arg: arguments){
           delete  arg;
           arg = nullptr;
        }
        arguments.clear();
    }